

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::~Builder(Builder *this)

{
  Builder *this_local;
  
  this->_vptr_Builder = (_func_int **)&PTR__Builder_013ae228;
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~unordered_map(&this->debugSourceId);
  std::
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~map(&this->debugId);
  std::
  map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  ::~map(&this->includeFiles);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~unordered_map(&this->stringIds);
  std::
  stack<spv::Builder::LoopBlocks,_std::deque<spv::Builder::LoopBlocks,_std::allocator<spv::Builder::LoopBlocks>_>_>
  ::~stack(&this->loops);
  std::stack<spv::Block_*,_std::deque<spv::Block_*,_std::allocator<spv::Block_*>_>_>::~stack
            (&this->switchMerges);
  std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::~vector
            (&this->nullConstants);
  std::
  unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
  ::~unordered_map(&this->groupedDebugTypes);
  std::
  unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
  ::~unordered_map(&this->groupedTypes);
  std::
  unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
  ::~unordered_map(&this->groupedStructConstants);
  std::
  unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
  ::~unordered_map(&this->groupedConstants);
  std::
  vector<std::unique_ptr<spv::Function,_std::default_delete<spv::Function>_>,_std::allocator<std::unique_ptr<spv::Function,_std::default_delete<spv::Function>_>_>_>
  ::~vector(&this->functions);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->externals);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->constantsTypesGlobals);
  std::
  set<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_spv::Builder::DecorationInstructionLessThan,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~set(&this->decorations);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->names);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->executionModes);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->entryPoints);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->imports);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->strings);
  AccessChain::~AccessChain(&this->accessChain);
  Module::~Module(&this->module);
  std::set<spv::Capability,_std::less<spv::Capability>,_std::allocator<spv::Capability>_>::~set
            (&this->capabilities);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(&this->moduleProcesses);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(&this->sourceExtensions);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->extensions);
  std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::~stack
            (&this->currentDebugScopeId);
  std::__cxx11::string::~string((string *)&this->sourceText);
  std::
  unordered_map<unsigned_int,_spv::Builder::DebugTypeLoc,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>_>
  ::~unordered_map(&this->debugTypeLocs);
  return;
}

Assistant:

Builder::~Builder()
{
}